

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cc
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  uint uVar2;
  uint8_t uVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  ostream *this;
  int iVar9;
  ostringstream *this_00;
  char *pcVar10;
  bool bVar11;
  uint8_t data;
  int num_column;
  int start_index;
  string residual_characters;
  string space;
  ostringstream stored_characters;
  string local_3a8 [368];
  ifstream ifs;
  byte abStack_218 [488];
  
  start_index = 0;
  num_column = 0x10;
  iVar9 = 0;
LAB_001035eb:
  do {
    while (iVar6 = ya_getopt_long(argc,argv,"s:c:o:h",(option *)0x0,(int *)0x0), iVar6 == 99) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&stored_characters);
      bVar11 = sptk::ConvertStringToInteger((string *)&ifs,&num_column);
      bVar4 = num_column < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar11 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -c option must be a positive integer")
        ;
        std::__cxx11::string::string
                  ((string *)&stored_characters,"fd",(allocator *)&residual_characters);
        sptk::PrintErrorMessage((string *)&stored_characters,(ostringstream *)&ifs);
LAB_0010392e:
        std::__cxx11::string::~string((string *)&stored_characters);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        return 1;
      }
    }
    if (iVar6 != 0x73) {
      if (iVar6 == -1) {
        if (1 < argc - ya_optind) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"Too many input files");
          std::__cxx11::string::string
                    ((string *)&stored_characters,"fd",(allocator *)&residual_characters);
          sptk::PrintErrorMessage((string *)&stored_characters,(ostringstream *)&ifs);
          goto LAB_0010392e;
        }
        if (argc == ya_optind) {
          pcVar10 = (char *)0x0;
        }
        else {
          pcVar10 = argv[ya_optind];
        }
        bVar4 = sptk::SetBinaryMode();
        this_00 = (ostringstream *)&ifs;
        if (!bVar4) {
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::operator<<((ostream *)this_00,"Cannot set translation mode");
          std::__cxx11::string::string
                    ((string *)&stored_characters,"fd",(allocator *)&residual_characters);
          sptk::PrintErrorMessage((string *)&stored_characters,(ostringstream *)&ifs);
          goto LAB_0010392e;
        }
        std::ifstream::ifstream(this_00);
        if ((pcVar10 != (char *)0x0) &&
           (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar10),
           (abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&stored_characters);
          poVar8 = std::operator<<((ostream *)&stored_characters,"Cannot open file ");
          std::operator<<(poVar8,pcVar10);
          std::__cxx11::string::string((string *)&residual_characters,"fd",(allocator *)&space);
          sptk::PrintErrorMessage(&residual_characters,&stored_characters);
          std::__cxx11::string::~string((string *)&residual_characters);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stored_characters);
          iVar9 = 1;
          goto LAB_00103bd0;
        }
        cVar5 = std::__basic_file<char>::is_open();
        if (cVar5 == '\0') {
          this_00 = (ostringstream *)&std::cin;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&stored_characters);
        iVar6 = start_index;
        break;
      }
      if (iVar6 == 0x68) {
        anon_unknown.dwarf_1dce::PrintUsage((ostream *)&std::cout);
        return 0;
      }
      if (iVar6 != 0x6f) {
        anon_unknown.dwarf_1dce::PrintUsage((ostream *)&std::cerr);
        return 1;
      }
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&stored_characters);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&residual_characters);
      if (bVar4) {
        bVar4 = sptk::IsInRange((int)residual_characters._M_dataplus._M_p,0,3);
        std::__cxx11::string::~string((string *)&ifs);
        iVar9 = (int)residual_characters._M_dataplus._M_p;
        if (bVar4) goto LAB_001035eb;
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar8 = std::operator<<((ostream *)&ifs,"The argument for the -o option must be an integer ")
      ;
      poVar8 = std::operator<<(poVar8,"in the range of ");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0);
      poVar8 = std::operator<<(poVar8," to ");
      std::ostream::operator<<((ostream *)poVar8,3);
      std::__cxx11::string::string((string *)&stored_characters,"fd",(allocator *)&space);
      sptk::PrintErrorMessage((string *)&stored_characters,(ostringstream *)&ifs);
      goto LAB_0010392e;
    }
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&stored_characters);
    bVar4 = sptk::ConvertStringToInteger((string *)&ifs,&start_index);
    bVar11 = start_index < 0;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar4 || bVar11) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar8 = std::operator<<((ostream *)&ifs,"The argument for the -s option must be a ");
      std::operator<<(poVar8,"non-negative integer");
      std::__cxx11::string::string
                ((string *)&stored_characters,"fd",(allocator *)&residual_characters);
      sptk::PrintErrorMessage((string *)&stored_characters,(ostringstream *)&ifs);
      goto LAB_0010392e;
    }
  } while( true );
LAB_00103992:
  bVar4 = sptk::ReadStream<unsigned_char>(&data,(istream *)this_00);
  if (!bVar4) {
    std::__cxx11::stringbuf::str();
    if (residual_characters._M_string_length != 0) {
      space._M_dataplus._M_p = (pointer)&space.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&space,
                 ((char)num_column - (char)residual_characters._M_string_length) * '\x03');
      poVar8 = std::operator<<((ostream *)&std::cout,(string *)&space);
      poVar8 = std::operator<<(poVar8,"|");
      poVar8 = std::operator<<(poVar8,(string *)&residual_characters);
      poVar8 = std::operator<<(poVar8,"|");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&space);
    }
    std::__cxx11::string::~string((string *)&residual_characters);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stored_characters);
    iVar9 = 0;
LAB_00103bd0:
    std::ifstream::~ifstream(&ifs);
    return iVar9;
  }
  if ((iVar6 - start_index) % num_column == 0) {
    if (iVar9 == 3) {
      this = (ostream *)std::operator<<(&std::cout,0x30);
      uVar2 = 0x40;
    }
    else if (iVar9 == 2) {
      this = (ostream *)std::operator<<(&std::cout,0x30);
      uVar2 = 2;
    }
    else {
      if (iVar9 != 1) goto LAB_00103a30;
      this = (ostream *)std::operator<<(&std::cout,0x30);
      uVar2 = 8;
    }
    lVar1 = *(long *)this;
    *(undefined8 *)(this + *(long *)(lVar1 + -0x18) + 0x10) = 6;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(this + lVar1 + 0x18) = *(uint *)(this + lVar1 + 0x18) & 0xffffffb5 | uVar2;
    poVar8 = (ostream *)std::ostream::operator<<(this,iVar6);
    std::operator<<(poVar8,"  ");
  }
LAB_00103a30:
  uVar3 = data;
  iVar7 = isprint((uint)data);
  if (iVar7 == 0) {
    std::operator<<((ostream *)&stored_characters,".");
  }
  else {
    std::operator<<((ostream *)&stored_characters,uVar3);
  }
  poVar8 = std::operator<<(&std::cout,0x30);
  lVar1 = *(long *)poVar8;
  *(undefined8 *)(poVar8 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar8 + lVar1 + 0x18) = *(uint *)(poVar8 + lVar1 + 0x18) & 0xffffffb5 | 8;
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,(uint)data);
  std::operator<<(poVar8," ");
  if (num_column + -1 == (iVar6 - start_index) % num_column) {
    poVar8 = std::operator<<((ostream *)&std::cout,"|");
    std::__cxx11::stringbuf::str();
    poVar8 = std::operator<<(poVar8,(string *)&residual_characters);
    std::operator<<(poVar8,"|\n");
    std::__cxx11::string::~string((string *)&residual_characters);
    std::__cxx11::string::string((string *)&residual_characters,"",(allocator *)&space);
    std::__cxx11::stringbuf::str(local_3a8);
    std::__cxx11::string::~string((string *)&residual_characters);
  }
  iVar6 = iVar6 + 1;
  goto LAB_00103992;
}

Assistant:

int main(int argc, char* argv[]) {
  int start_index(kDefaultStartIndex);
  int num_column(kDefaultNumColumn);
  AddressFormats address_format(kDefaultAddressFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "s:c:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &start_index) ||
            start_index < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("fd", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToInteger(optarg, &num_column) ||
            num_column <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("fd", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumAddressFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("fd", error_message);
          return 1;
        }
        address_format = static_cast<AddressFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("fd", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("fd", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("fd", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  std::uint8_t data;
  std::ostringstream stored_characters;

  for (int index(start_index); sptk::ReadStream(&data, &input_stream);
       ++index) {
    // Output address.
    if (0 == (index - start_index) % num_column) {
      switch (address_format) {
        case kNone: {
          // nothing to do
          break;
        }
        case kHexadecimal: {
          std::cout << std::setfill('0') << std::setw(6) << std::hex << index
                    << "  ";
          break;
        }
        case kDecimal: {
          std::cout << std::setfill('0') << std::setw(6) << std::dec << index
                    << "  ";
          break;
        }
        case kOctal: {
          std::cout << std::setfill('0') << std::setw(6) << std::oct << index
                    << "  ";
          break;
        }
        default: {
          break;
        }
      }
    }

    // Stack human-readable characters.
    if (std::isprint(data)) {
      stored_characters << data;
    } else {
      stored_characters << ".";
    }

    // Output data.
    std::cout << std::setfill('0') << std::setw(2) << std::hex
              << static_cast<int>(data) << " ";

    // Output new line.
    if (num_column - 1 == (index - start_index) % num_column) {
      std::cout << "|" << stored_characters.str() << "|\n";
      stored_characters.str("");  // Clear.
    }
  }

  // Flush.
  const std::string residual_characters(stored_characters.str());
  if (!residual_characters.empty()) {
    const std::string space(3 * (num_column - residual_characters.size()), ' ');
    std::cout << space << "|" << residual_characters << "|" << std::endl;
  }

  return 0;
}